

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jitshared.c
# Opt level: O0

void emit_op_tforloop(function *fn,int A,int j,int pc)

{
  int pc_local;
  int j_local;
  int A_local;
  function *fn_local;
  
  emit_reg(fn,"ra",A);
  membuff_add_string(&fn->body,"if (!ttisnil(ra + 1)) {\n");
  membuff_add_string(&fn->body," rb = ra + 1;\n");
  membuff_add_string(&fn->body," setobjs2s(L, ra, rb);\n");
  membuff_add_fstring(&fn->body," goto Lbc_%d;\n",(ulong)(uint)j);
  membuff_add_string(&fn->body,"}\n");
  return;
}

Assistant:

static void emit_op_tforloop(struct function *fn, int A, int j, int pc) {
  (void)pc;
  emit_reg(fn, "ra", A);
  membuff_add_string(&fn->body, "if (!ttisnil(ra + 1)) {\n");
  membuff_add_string(&fn->body, " rb = ra + 1;\n");
  membuff_add_string(&fn->body, " setobjs2s(L, ra, rb);\n");
  membuff_add_fstring(&fn->body, " goto Lbc_%d;\n", j);
  membuff_add_string(&fn->body, "}\n");
}